

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O0

int realloc_frame_buffer_aligned
              (YV12_BUFFER_CONFIG *ybf,int width,int height,int ss_x,int ss_y,int use_highbitdepth,
              int border,int byte_alignment,aom_codec_frame_buffer_t *fb,
              aom_get_frame_buffer_cb_fn_t cb,void *cb_priv,int y_stride,uint64_t yplane_size,
              uint64_t uvplane_size,int aligned_width,int aligned_height,int uv_width,int uv_height,
              int uv_stride,int uv_border_w,int uv_border_h,_Bool alloc_pyramid,
              int alloc_y_plane_only)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  ImagePyramid *pIVar7;
  CornerList *pCVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint64_t external_frame_size;
  int in_stack_00000018;
  int align_addr_extra_size;
  uint64_t alloc_size;
  uint8_t *buf;
  uint64_t frame_size;
  long in_stack_00000038;
  int aom_byte_align;
  undefined3 in_stack_00000040;
  int in_stack_00000060;
  int in_stack_00000068;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_40;
  int local_4;
  
  if (in_RDI == (int *)0x0) {
    local_4 = 2;
  }
  else {
    if ((int)external_frame_size == 0) {
      external_frame_size._0_4_ = 1;
    }
    uVar2 = (long)(in_R9D + 1) *
            (in_stack_00000038 + CONCAT44(use_highbitdepth,_in_stack_00000040) * 2);
    iVar1 = (int)external_frame_size;
    uVar5 = uVar2;
    if (((ulong)fb & 1) != 0) {
      sVar3 = aom_get_pyramid_alloc_size
                        ((int)((ulong)in_RDI >> 0x20),(int)in_RDI,SUB41((uint)in_ESI >> 0x18,0));
      lVar4 = sVar3 + uVar5;
      sVar3 = av1_get_corner_list_size();
      uVar5 = sVar3 + lVar4;
    }
    if (uVar5 < 0x40000001) {
      if (alloc_size == 0) {
        if (*(ulong *)(in_RDI + 0x1e) < uVar2) {
          aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
          in_RDI[0x1c] = 0;
          in_RDI[0x1d] = 0;
          in_RDI[0x1e] = 0;
          in_RDI[0x1f] = 0;
          pvVar6 = aom_memalign(uVar5,CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
          ;
          *(void **)(in_RDI + 0x1c) = pvVar6;
          if (*(long *)(in_RDI + 0x1c) == 0) {
            return 2;
          }
          *(ulong *)(in_RDI + 0x1e) = uVar2;
          memset(*(void **)(in_RDI + 0x1c),0,*(size_t *)(in_RDI + 0x1e));
        }
      }
      else {
        iVar1 = (*(code *)alloc_size)
                          (buf,uVar2 + 0x1f,CONCAT44(align_addr_extra_size,in_stack_00000018));
        if (iVar1 < 0) {
          return 2;
        }
        if ((*(long *)CONCAT44(align_addr_extra_size,in_stack_00000018) == 0) ||
           (*(ulong *)(CONCAT44(align_addr_extra_size,in_stack_00000018) + 8) < uVar2 + 0x1f)) {
          return 2;
        }
        *(ulong *)(in_RDI + 0x1c) =
             *(long *)CONCAT44(align_addr_extra_size,in_stack_00000018) + 0x1fU & 0xffffffffffffffe0
        ;
      }
      in_RDI[4] = in_ESI;
      in_RDI[6] = in_EDX;
      *in_RDI = ss_y;
      in_RDI[2] = height;
      in_RDI[8] = (int)frame_size;
      in_RDI[5] = in_ESI + in_ECX >> ((byte)in_ECX & 0x1f);
      in_RDI[7] = in_EDX + in_R8D >> ((byte)in_R8D & 0x1f);
      in_RDI[1] = (int)ybf;
      in_RDI[3] = in_stack_00000060;
      in_RDI[9] = in_stack_00000068;
      in_RDI[0x20] = in_stack_00000008;
      *(ulong *)(in_RDI + 0x22) = uVar2;
      in_RDI[0x24] = in_ECX;
      in_RDI[0x25] = in_R8D;
      local_40 = *(ulong *)(in_RDI + 0x1c);
      if (in_R9D == 0) {
        in_RDI[0x30] = 0;
      }
      else {
        local_40 = *(ulong *)(in_RDI + 0x1c) >> 1;
        in_RDI[0x30] = 8;
      }
      *(ulong *)(in_RDI + 10) =
           local_40 + (long)(in_stack_00000008 * (int)frame_size) + (long)in_stack_00000008 +
           (long)((int)external_frame_size + -1) &
           ((long)((int)external_frame_size + -1) ^ 0xffffffffffffffffU);
      if ((int)cb == 0) {
        *(ulong *)(in_RDI + 0xc) =
             local_40 + in_stack_00000038 + (long)(byte_alignment * in_stack_00000068) +
             (long)border + (long)((int)external_frame_size + -1) &
             ((long)((int)external_frame_size + -1) ^ 0xffffffffffffffffU);
        *(ulong *)(in_RDI + 0xe) =
             local_40 + in_stack_00000038 + CONCAT44(use_highbitdepth,_in_stack_00000040) +
             (long)(byte_alignment * in_stack_00000068) + (long)border +
             (long)((int)external_frame_size + -1) &
             ((long)((int)external_frame_size + -1) ^ 0xffffffffffffffffU);
      }
      else {
        in_RDI[0xc] = 0;
        in_RDI[0xd] = 0;
        in_RDI[0xe] = 0;
        in_RDI[0xf] = 0;
      }
      in_RDI[0x10] = 0;
      if (*(long *)(in_RDI + 0x18) != 0) {
        aom_free_pyramid((ImagePyramid *)0x69fe83);
        in_RDI[0x18] = 0;
        in_RDI[0x19] = 0;
      }
      if (*(long *)(in_RDI + 0x1a) != 0) {
        av1_free_corner_list((CornerList *)0x69feaa);
        in_RDI[0x1a] = 0;
        in_RDI[0x1b] = 0;
      }
      if (((ulong)fb & 1) != 0) {
        pIVar7 = aom_alloc_pyramid(align_addr_extra_size,in_stack_00000018,external_frame_size._7_1_
                                  );
        *(ImagePyramid **)(in_RDI + 0x18) = pIVar7;
        if (*(long *)(in_RDI + 0x18) == 0) {
          return 2;
        }
        pCVar8 = av1_alloc_corner_list();
        *(CornerList **)(in_RDI + 0x1a) = pCVar8;
        if (*(long *)(in_RDI + 0x1a) == 0) {
          return 2;
        }
      }
      in_RDI[0x2f] = 0;
      local_4 = 0;
    }
    else {
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

static int realloc_frame_buffer_aligned(
    YV12_BUFFER_CONFIG *ybf, int width, int height, int ss_x, int ss_y,
    int use_highbitdepth, int border, int byte_alignment,
    aom_codec_frame_buffer_t *fb, aom_get_frame_buffer_cb_fn_t cb,
    void *cb_priv, const int y_stride, const uint64_t yplane_size,
    const uint64_t uvplane_size, const int aligned_width,
    const int aligned_height, const int uv_width, const int uv_height,
    const int uv_stride, const int uv_border_w, const int uv_border_h,
    bool alloc_pyramid, int alloc_y_plane_only) {
  if (ybf) {
    const int aom_byte_align = (byte_alignment == 0) ? 1 : byte_alignment;
    const uint64_t frame_size =
        (1 + use_highbitdepth) * (yplane_size + 2 * uvplane_size);

    uint8_t *buf = NULL;

#if CONFIG_REALTIME_ONLY || !CONFIG_AV1_ENCODER
    // We should only need an 8-bit version of the source frame if we are
    // encoding in non-realtime mode
    (void)alloc_pyramid;
    assert(!alloc_pyramid);
#endif  // CONFIG_REALTIME_ONLY || !CONFIG_AV1_ENCODER

#if defined AOM_MAX_ALLOCABLE_MEMORY
    // The size of ybf->buffer_alloc.
    uint64_t alloc_size = frame_size;
#if CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
    // The size of ybf->y_pyramid
    if (alloc_pyramid) {
      alloc_size += aom_get_pyramid_alloc_size(width, height, use_highbitdepth);
      alloc_size += av1_get_corner_list_size();
    }
#endif  // CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
    // The decoder may allocate REF_FRAMES frame buffers in the frame buffer
    // pool. Bound the total amount of allocated memory as if these REF_FRAMES
    // frame buffers were allocated in a single allocation.
    if (alloc_size > AOM_MAX_ALLOCABLE_MEMORY / REF_FRAMES)
      return AOM_CODEC_MEM_ERROR;
#endif

    if (cb != NULL) {
      const int align_addr_extra_size = 31;
      const uint64_t external_frame_size = frame_size + align_addr_extra_size;

      assert(fb != NULL);

      if (external_frame_size != (size_t)external_frame_size)
        return AOM_CODEC_MEM_ERROR;

      // Allocation to hold larger frame, or first allocation.
      if (cb(cb_priv, (size_t)external_frame_size, fb) < 0)
        return AOM_CODEC_MEM_ERROR;

      if (fb->data == NULL || fb->size < external_frame_size)
        return AOM_CODEC_MEM_ERROR;

      ybf->buffer_alloc = (uint8_t *)aom_align_addr(fb->data, 32);

#if defined(__has_feature)
#if __has_feature(memory_sanitizer)
      // This memset is needed for fixing the issue of using uninitialized
      // value in msan test. It will cause a perf loss, so only do this for
      // msan test.
      memset(ybf->buffer_alloc, 0, (size_t)frame_size);
#endif
#endif
    } else if (frame_size > ybf->buffer_alloc_sz) {
      // Allocation to hold larger frame, or first allocation.
      aom_free(ybf->buffer_alloc);
      ybf->buffer_alloc = NULL;
      ybf->buffer_alloc_sz = 0;

      if (frame_size != (size_t)frame_size) return AOM_CODEC_MEM_ERROR;

      ybf->buffer_alloc = (uint8_t *)aom_memalign(32, (size_t)frame_size);
      if (!ybf->buffer_alloc) return AOM_CODEC_MEM_ERROR;

      ybf->buffer_alloc_sz = (size_t)frame_size;

      // This memset is needed for fixing valgrind error from C loop filter
      // due to access uninitialized memory in frame border. It could be
      // removed if border is totally removed.
      memset(ybf->buffer_alloc, 0, ybf->buffer_alloc_sz);
    }

    ybf->y_crop_width = width;
    ybf->y_crop_height = height;
    ybf->y_width = aligned_width;
    ybf->y_height = aligned_height;
    ybf->y_stride = y_stride;

    ybf->uv_crop_width = (width + ss_x) >> ss_x;
    ybf->uv_crop_height = (height + ss_y) >> ss_y;
    ybf->uv_width = uv_width;
    ybf->uv_height = uv_height;
    ybf->uv_stride = uv_stride;

    ybf->border = border;
    ybf->frame_size = (size_t)frame_size;
    ybf->subsampling_x = ss_x;
    ybf->subsampling_y = ss_y;

    buf = ybf->buffer_alloc;
    if (use_highbitdepth) {
      // Store uint16 addresses when using 16bit framebuffers
      buf = CONVERT_TO_BYTEPTR(ybf->buffer_alloc);
      ybf->flags = YV12_FLAG_HIGHBITDEPTH;
    } else {
      ybf->flags = 0;
    }

    ybf->y_buffer = (uint8_t *)aom_align_addr(
        buf + (border * y_stride) + border, aom_byte_align);
    if (!alloc_y_plane_only) {
      ybf->u_buffer = (uint8_t *)aom_align_addr(
          buf + yplane_size + (uv_border_h * uv_stride) + uv_border_w,
          aom_byte_align);
      ybf->v_buffer =
          (uint8_t *)aom_align_addr(buf + yplane_size + uvplane_size +
                                        (uv_border_h * uv_stride) + uv_border_w,
                                    aom_byte_align);
    } else {
      ybf->u_buffer = NULL;
      ybf->v_buffer = NULL;
    }

    ybf->use_external_reference_buffers = 0;

#if CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
    if (ybf->y_pyramid) {
      aom_free_pyramid(ybf->y_pyramid);
      ybf->y_pyramid = NULL;
    }
    if (ybf->corners) {
      av1_free_corner_list(ybf->corners);
      ybf->corners = NULL;
    }
    if (alloc_pyramid) {
      ybf->y_pyramid = aom_alloc_pyramid(width, height, use_highbitdepth);
      if (!ybf->y_pyramid) return AOM_CODEC_MEM_ERROR;
      ybf->corners = av1_alloc_corner_list();
      if (!ybf->corners) return AOM_CODEC_MEM_ERROR;
    }
#endif  // CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY

    ybf->corrupted = 0; /* assume not corrupted by errors */
    return 0;
  }
  return AOM_CODEC_MEM_ERROR;
}